

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

string * __thiscall
leveldb::Reverse_abi_cxx11_(string *__return_storage_ptr__,leveldb *this,Slice *key)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  undefined1 *puVar1;
  string str;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,*(long *)this,*(long *)(this + 8) + *(long *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  for (puVar1 = local_40 + local_38; puVar1 != local_40; puVar1 = puVar1 + -1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Reverse(const Slice& key) {
  std::string str(key.ToString());
  std::string rev("");
  for (std::string::reverse_iterator rit = str.rbegin(); rit != str.rend();
       ++rit) {
    rev.push_back(*rit);
  }
  return rev;
}